

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Boost::set(V2Boost *this,syVBoost *para)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float __x;
  
  fVar2 = para->amount;
  bVar1 = (int)fVar2 != 0;
  this->enabled = bVar1;
  if (bVar1) {
    fVar2 = exp2f(fVar2 * 0.0078125);
    __x = fVar2 + fVar2;
    if (__x < 0.0) {
      fVar3 = sqrtf(__x);
    }
    else {
      fVar3 = SQRT(__x);
    }
    fVar3 = fVar3 * this->inst->SRfcBoostSin;
    fVar6 = fVar2 + -1.0;
    fVar5 = fVar2 + 1.0;
    fVar7 = this->inst->SRfcBoostCos;
    fVar8 = fVar6 * fVar7;
    fVar7 = fVar7 * fVar5;
    fVar9 = fVar5 + fVar8;
    fVar4 = 1.0 / (fVar3 + fVar9);
    this->b1 = __x * (fVar6 - fVar7) * fVar4;
    this->a1 = (fVar7 + fVar6) * -2.0 * fVar4;
    this->a2 = (fVar9 - fVar3) * fVar4;
    fVar5 = fVar5 - fVar8;
    this->b0 = (fVar3 + fVar5) * fVar2 * fVar4;
    this->b2 = (fVar5 - fVar3) * fVar2 * fVar4;
  }
  return;
}

Assistant:

void set(const syVBoost *para)
    {
        enabled = ((int)para->amount) != 0;
        if (!enabled)
            return;

        COVER("BOOST set");

        // A = 10^(dBgain/40), or a rough approximation anyway
        float A = powf(2.0f, para->amount / 128.0f);

        // V2 code computes beta = sqrt((A^2 + 1) - (A-1)^2) for some reason
        // but applying the binomial formula just gives sqrt(2A)
        float beta = sqrtf(2.0f * A);

        // temp vars
        float bs = beta * inst->SRfcBoostSin;
        float Am1 = A - 1.0f;
        float Ap1 = A + 1.0f;
        float cAm1 = Am1 * inst->SRfcBoostCos;
        float cAp1 = Ap1 * inst->SRfcBoostCos;

        // a0 = (A+1) + (A-1)*cos + beta*sin
        float ia0 = 1.0f / (Ap1 + cAm1 + bs);

        b1 = 2.0f * A * (Am1 - cAp1) * ia0;
        a1 = -2.0f * (Am1 + cAp1) * ia0;
        a2 = (Ap1 + cAm1 - bs) * ia0;
        b0 = A * (Ap1 - cAm1 + bs) * ia0;
        b2 = A * (Ap1 - cAm1 - bs) * ia0;
    }